

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void DupWhileImplementation(bool isWhile)

{
  bool bVar1;
  int iVar2;
  SRepeatStack *this;
  size_t sVar3;
  char *pcVar4;
  char *local_78;
  bool local_61;
  CStringsList *local_58;
  char *local_50;
  char *guardianSource;
  char *pcStack_40;
  bool parseOk;
  char *expressionSource;
  char *local_28;
  char *indexVar;
  SRepeatStack *dup;
  CStringsList *condition;
  aint val;
  bool isWhile_local;
  
  condition._0_4_ = 0;
  dup = (SRepeatStack *)0x0;
  condition._7_1_ = isWhile;
  bVar1 = std::stack<SRepeatStack,_std::deque<SRepeatStack,_std::allocator<SRepeatStack>_>_>::empty
                    (&RepeatStack);
  if ((!bVar1) &&
     (indexVar = &std::stack<SRepeatStack,_std::deque<SRepeatStack,_std::allocator<SRepeatStack>_>_>
                  ::top(&RepeatStack)->IsPseudoOpBOF,
     ((ulong)((reference)((long)indexVar + 0x20))->MultiArg & 1) == 0)) {
    SkipToEol(&lp);
    *(int *)(indexVar + 0x3c) = *(int *)(indexVar + 0x3c) + 1;
    return;
  }
  local_28 = (char *)0x0;
  if ((condition._7_1_ & 1) == 0) {
    IsLabelNotFound = false;
    iVar2 = ParseExpressionNoSyntaxError(&lp,(aint *)&condition);
    if (iVar2 == 0) {
      Error("[DUP/REPT] Syntax error in <count>",lp,SUPPRESS);
      return;
    }
    if ((IsLabelNotFound & 1U) != 0) {
      Error("[DUP/REPT] Forward reference",(char *)0x0,ALL);
    }
    if ((int)condition < 0) {
      ErrorInt("[DUP/REPT] Repeat value must be positive or zero",(int)condition,IF_FIRST);
      return;
    }
    bVar1 = comma(&lp);
    if ((bVar1) && (local_28 = GetID(&lp), local_28 == (char *)0x0)) {
      Error("[DUP/REPT] invalid index variable name",lp,IF_FIRST);
      SkipToEol(&lp);
    }
  }
  else {
    this = (SRepeatStack *)operator_new(0x28);
    CStringsList::CStringsList((CStringsList *)this,lp,(CStringsList *)0x0);
    dup = this;
    if (this == (SRepeatStack *)0x0) {
      ErrorOOM();
    }
    sVar3 = strlen(*(char **)dup);
    lp = lp + sVar3;
    pcStack_40 = *(char **)dup;
    iVar2 = ParseExpressionNoSyntaxError(&stack0xffffffffffffffc0,(aint *)&condition);
    guardianSource._7_1_ = iVar2 != 0;
    if ((((bool)guardianSource._7_1_) && (*pcStack_40 != '\0')) &&
       (bVar1 = comma(&stack0xffffffffffffffc0), bVar1)) {
      local_50 = pcStack_40;
      local_61 = false;
      if ((guardianSource._7_1_ & 1) != 0) {
        iVar2 = ParseExpressionNoSyntaxError(&local_50,(aint *)&condition);
        local_61 = iVar2 != 0;
      }
      guardianSource._7_1_ = local_61;
      if (local_61 != false) {
        if (pcStack_40[-1] != ',') {
          __assert_fail("\',\' == expressionSource[-1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/directives.cpp"
                        ,0x74c,"void DupWhileImplementation(bool)");
        }
        pcStack_40[-1] = '\0';
        condition._0_4_ = (int)condition + 1;
      }
    }
    else {
      condition._0_4_ = 0x186a1;
    }
    if ((guardianSource._7_1_ & 1) == 0) {
      Error("[WHILE] Syntax error in <expression>",*(char **)dup,SUPPRESS);
      free(*(void **)dup);
      pcVar4 = strdup("0");
      *(char **)dup = pcVar4;
      condition._0_4_ = 1;
    }
  }
  local_58 = (CStringsList *)operator_new(0x28);
  if (local_28 == (char *)0x0) {
    local_78 = "";
  }
  else {
    local_78 = local_28;
  }
  CStringsList::CStringsList(local_58,local_78,(CStringsList *)0x0);
  std::stack<SRepeatStack,std::deque<SRepeatStack,std::allocator<SRepeatStack>>>::
  emplace<int&,CStringsList*&,CStringsList*>
            ((stack<SRepeatStack,std::deque<SRepeatStack,std::allocator<SRepeatStack>>> *)
             &RepeatStack,(int *)&condition,(CStringsList **)&dup,&local_58);
  iVar2 = SkipBlanks();
  if (iVar2 == 0) {
    Error("[DUP] unexpected chars",lp,SUPPRESS);
  }
  return;
}

Assistant:

static void DupWhileImplementation(bool isWhile) {
	aint val = 0;
	CStringsList* condition = nullptr;

	if (!RepeatStack.empty()) {
		SRepeatStack& dup = RepeatStack.top();
		if (!dup.IsInWork) {
			SkipToEol(lp);		// Just skip the expression to the end of line, don't evaluate yet
			++dup.Level;
			return;
		}
	}

	const char* indexVar = nullptr;
	if (isWhile) {
		condition = new CStringsList(lp);
		if (nullptr == condition) ErrorOOM();
		lp += strlen(condition->string);
		// scan condition string for extra guardian value, and split + parse it as needed
		char* expressionSource = condition->string;
		bool parseOk = ParseExpressionNoSyntaxError(expressionSource, val);
		if (parseOk && *expressionSource && comma(expressionSource)) {
			// comma found, try to parse explicit guardian value
			char* guardianSource = expressionSource;
			parseOk = parseOk && ParseExpressionNoSyntaxError(guardianSource, val);
			// overwrite the comma to keep only condition string without guardian argument
			if (parseOk) {
				assert(',' == expressionSource[-1]);
				expressionSource[-1] = 0;
				++val;		// +1 to explicit value to report error when WHILE does *over* that
			}
		} else {
			val = 100001;	// default guardian value is 100k
		}
		if (!parseOk) {
			Error("[WHILE] Syntax error in <expression>", condition->string, SUPPRESS);
			free(condition->string);			// release original string
			condition->string = STRDUP("0");	// force it to evaluate to zero
			val = 1;
		}
	} else {
		IsLabelNotFound = false;
		if (!ParseExpressionNoSyntaxError(lp, val)) {
			Error("[DUP/REPT] Syntax error in <count>", lp, SUPPRESS);
			return;
		}
		if (IsLabelNotFound) {
			Error("[DUP/REPT] Forward reference", NULL, ALL);
		}
		if ((int) val < 0) {
			ErrorInt("[DUP/REPT] Repeat value must be positive or zero", val, IF_FIRST); return;
		}
		if (comma(lp)) {
			indexVar = GetID(lp);
			if (nullptr == indexVar) {
				Error("[DUP/REPT] invalid index variable name", lp, IF_FIRST);
				SkipToEol(lp);
			}
		}
	}

	RepeatStack.emplace(val, condition, new CStringsList(indexVar ? indexVar : ""));
	if (!SkipBlanks()) Error("[DUP] unexpected chars", lp, SUPPRESS);
}